

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O2

float __thiscall nv::FloatImage::sampleNearest(FloatImage *this,float x,float y,int c,WrapMode wm)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  
  if (wm == WrapMode_Repeat) {
    fVar5 = floorf(x);
    uVar1 = this->m_width;
    fVar6 = floorf(y);
    return this->m_mem
           [(c * (uint)this->m_height + (int)((float)this->m_height * (y - fVar6))) * (uint)uVar1 +
            (int)((float)uVar1 * (x - fVar5))];
  }
  if (wm == WrapMode_Clamp) {
    fVar5 = sampleNearestClamp(this,x,y,c);
    return fVar5;
  }
  uVar1 = this->m_width;
  iVar3 = anon_unknown.dwarf_4c3dee::mirror((int)((float)uVar1 * x),(uint)uVar1);
  uVar2 = this->m_height;
  iVar4 = anon_unknown.dwarf_4c3dee::mirror((int)((float)uVar2 * y),(uint)uVar2);
  return this->m_mem[(c * (uint)uVar2 + iVar4) * (uint)uVar1 + iVar3];
}

Assistant:

float FloatImage::sampleNearest(const float x, const float y, const int c, const WrapMode wm) const
{
	if( wm == WrapMode_Clamp ) return sampleNearestClamp(x, y, c);
	else if( wm == WrapMode_Repeat ) return sampleNearestRepeat(x, y, c);
	else /*if( wm == WrapMode_Mirror )*/ return sampleNearestMirror(x, y, c);
}